

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRotation.hpp
# Opt level: O0

QRotation<double> * __thiscall
qclab::QRotation<double>::operator/=(QRotation<double> *this,QRotation<double> *rhs)

{
  QAngle<double> lhs;
  angle_type *this_00;
  QAngle<double> local_28;
  QRotation<double> *local_18;
  QRotation<double> *rhs_local;
  QRotation<double> *this_local;
  
  lhs = this->angle_;
  local_18 = rhs;
  rhs_local = this;
  this_00 = angle(rhs);
  local_28 = qclab::operator-((qclab *)this_00,lhs,&rhs->angle_);
  update(this,&local_28);
  return this;
}

Assistant:

inline QRotation< T >& operator/=( const QRotation< T >& rhs ) {
        update( angle_ - rhs.angle() ) ;
        return *this ;
      }